

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid_tools.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  unsigned_long_long uVar3;
  longlong lVar4;
  long in_RSI;
  int in_EDI;
  int64_t limit_4;
  int64_t limit_3;
  uint64_t limit_2;
  uint64_t start_2;
  int limit_1;
  int start_1;
  uint64_t limit;
  uint64_t start;
  string command;
  size_t *in_stack_fffffffffffffda8;
  string *in_stack_fffffffffffffdb0;
  string *__str;
  longlong local_230;
  char *in_stack_fffffffffffffde0;
  unsigned_long_long local_218;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  uint64_t in_stack_fffffffffffffe10;
  char *pcVar5;
  int64_t in_stack_fffffffffffffe20;
  unsigned_long_long local_1d0;
  undefined5 in_stack_fffffffffffffe50;
  byte bVar6;
  byte bVar7;
  allocator in_stack_fffffffffffffe57;
  string local_1a8 [24];
  int in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe74;
  allocator local_179;
  string local_178 [32];
  longlong local_158;
  byte local_14b;
  byte local_14a;
  allocator local_149;
  string local_148 [32];
  uint64_t local_128;
  allocator local_119;
  string local_118 [32];
  unsigned_long_long local_f8;
  allocator local_e9;
  string local_e8 [32];
  int local_c8;
  allocator local_c1;
  string local_c0 [36];
  int local_9c;
  int local_98;
  byte local_93;
  byte local_92;
  allocator local_91;
  string local_90 [32];
  unsigned_long_long local_70;
  allocator local_61;
  string local_60 [32];
  unsigned_long_long local_40;
  allocator local_31;
  string local_30 [32];
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  if (in_EDI < 2) goto LAB_00103e73;
  pcVar5 = *(char **)(in_RSI + 8);
  local_10 = in_RSI;
  local_8 = in_EDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,pcVar5,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  bVar1 = std::operator==(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
  if (bVar1) {
    if (local_8 < 3) {
LAB_00103e4a:
      local_98 = 0;
    }
    else {
      pcVar5 = *(char **)(local_10 + 0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_60,pcVar5,&local_61);
      uVar3 = std::__cxx11::stoull(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,0);
      std::__cxx11::string::~string(local_60);
      std::allocator<char>::~allocator((allocator<char> *)&local_61);
      local_92 = 0;
      local_93 = 0;
      local_40 = uVar3;
      if (local_8 < 4) {
        local_1d0 = 1;
      }
      else {
        pcVar5 = *(char **)(local_10 + 0x18);
        std::allocator<char>::allocator();
        local_92 = 1;
        std::__cxx11::string::string(local_90,pcVar5,&local_91);
        local_93 = 1;
        local_1d0 = std::__cxx11::stoull(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,0);
      }
      if ((local_93 & 1) != 0) {
        std::__cxx11::string::~string(local_90);
      }
      if ((local_92 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_91);
      }
      local_70 = local_1d0;
      ListPatterns(in_stack_fffffffffffffe10,
                   CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      local_4 = 0;
      local_98 = 1;
    }
  }
  else {
    bVar1 = std::operator==(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
    if (bVar1) {
      if (local_8 != 4) goto LAB_00103e4a;
      pcVar5 = *(char **)(local_10 + 0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c0,pcVar5,&local_c1);
      iVar2 = std::__cxx11::stoi(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,0);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      pcVar5 = *(char **)(local_10 + 0x18);
      local_9c = iVar2;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e8,pcVar5,&local_e9);
      iVar2 = std::__cxx11::stoi(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,0);
      std::__cxx11::string::~string(local_e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_e9);
      local_c8 = iVar2;
      CountGrids(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70);
      local_4 = 0;
      local_98 = 1;
    }
    else {
      bVar1 = std::operator==(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
      if (bVar1) {
        MakeTables();
        local_4 = 0;
        local_98 = 1;
      }
      else {
        bVar1 = std::operator==(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
        if (bVar1) {
          if (local_8 < 3) goto LAB_00103e4a;
          pcVar5 = *(char **)(local_10 + 0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_118,pcVar5,&local_119);
          uVar3 = std::__cxx11::stoull(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,0);
          std::__cxx11::string::~string(local_118);
          std::allocator<char>::~allocator((allocator<char> *)&local_119);
          local_14a = 0;
          local_14b = 0;
          local_f8 = uVar3;
          if (local_8 < 4) {
            local_218 = 1;
          }
          else {
            in_stack_fffffffffffffde0 = *(char **)(local_10 + 0x18);
            std::allocator<char>::allocator();
            local_14a = 1;
            std::__cxx11::string::string(local_148,in_stack_fffffffffffffde0,&local_149);
            local_14b = 1;
            local_218 = std::__cxx11::stoull(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,0);
          }
          if ((local_14b & 1) != 0) {
            std::__cxx11::string::~string(local_148);
          }
          if ((local_14a & 1) != 0) {
            std::allocator<char>::~allocator((allocator<char> *)&local_149);
          }
          local_128 = local_218;
          ListGrids((uint64_t)in_stack_fffffffffffffde0,local_218);
          local_4 = 0;
          local_98 = 1;
        }
        else {
          bVar1 = std::operator==(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
          if (bVar1) {
            if (local_8 < 3) {
              local_230 = -1;
              local_158 = local_230;
            }
            else {
              pcVar5 = *(char **)(local_10 + 0x10);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_178,pcVar5,&local_179);
              lVar4 = std::__cxx11::stoll(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,0);
              std::__cxx11::string::~string(local_178);
              std::allocator<char>::~allocator((allocator<char> *)&local_179);
              local_158 = lVar4;
            }
            SampleGrids(in_stack_fffffffffffffe20);
            local_4 = 0;
            local_98 = 1;
          }
          else {
            bVar1 = std::operator==(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
            if (!bVar1) goto LAB_00103e4a;
            bVar7 = 0;
            bVar6 = 0;
            if (2 < local_8) {
              __str = *(string **)(local_10 + 0x10);
              std::allocator<char>::allocator();
              bVar7 = 1;
              std::__cxx11::string::string
                        (local_1a8,(char *)__str,(allocator *)&stack0xfffffffffffffe57);
              bVar6 = 1;
              std::__cxx11::stoll(__str,in_stack_fffffffffffffda8,0);
            }
            if ((bVar6 & 1) != 0) {
              std::__cxx11::string::~string(local_1a8);
            }
            if ((bVar7 & 1) != 0) {
              std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe57);
            }
            SamplePuzzles(CONCAT17(in_stack_fffffffffffffe57,
                                   CONCAT16(bVar7,CONCAT15(bVar6,in_stack_fffffffffffffe50))));
            local_4 = 0;
            local_98 = 1;
          }
        }
      }
    }
  }
  std::__cxx11::string::~string(local_30);
  if (local_98 != 0) {
    return local_4;
  }
LAB_00103e73:
  usage();
  return local_4;
}

Assistant:

int main(int argc, char **argv) {
    if (argc > 1) {
        string command(argv[1]);
        if (command == "pattern") {
            if (argc > 2) {
                uint64_t start = stoull(argv[2]);
                uint64_t limit = argc > 3 ? stoull(argv[3]) : 1u;
                ListPatterns(start, limit);
                return 0;
            }
        } else if (command == "count_grids") {
            if (argc == 4) {
                int start = stoi(argv[2]);
                int limit = stoi(argv[3]);
                CountGrids(start, limit);
                return 0;
            }
        } else if (command == "make_tables") {
            MakeTables();
            return 0;
        } else if (command == "list_grids") {
            if (argc > 2) {
                uint64_t start = stoull(argv[2]);
                uint64_t limit = argc > 3 ? stoull(argv[3]) : 1u;
                ListGrids(start, limit);
                return 0;
            }
        } else if (command == "sample_grids") {
            int64_t limit = argc > 2 ? stoll(argv[2]) : -1;
            SampleGrids(limit);
            return 0;
        } else if (command == "sample_puzzles") {
            int64_t limit = argc > 2 ? stoll(argv[2]) : -1;
            SamplePuzzles(limit);
            return 0;
        }
    }
    usage();
}